

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_517d7::SignalAction::apply_to(SignalAction *this,int signum,bool restart)

{
  byte *pbVar1;
  int iVar2;
  ContextManager *pCVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000011,restart) != 0) {
    pbVar1 = (byte *)((long)&(this->sigaction).sa_flags + 3);
    *pbVar1 = *pbVar1 | 0x10;
  }
  iVar2 = sigaction(signum,(sigaction *)this,(sigaction *)0x0);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    pcVar4 = strsignal(signum);
    format_abi_cxx11_(&local_40,"Cannot set signal action for %s: %m",pcVar4);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (restart) {
    pbVar1 = (byte *)((long)&(this->sigaction).sa_flags + 3);
    *pbVar1 = *pbVar1 & 0xef;
  }
  return;
}

Assistant:

void apply_to(int signum, bool restart = false) const {
        if (restart) {
            sigaction.sa_flags |= SA_RESTART;
        }
        if (::sigaction(signum, &sigaction, nullptr)) {
            die(format("Cannot set signal action for %s: %m", strsignal(signum)));
        }
        if (restart) {
            sigaction.sa_flags &= (~SA_RESTART);
        }
    }